

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParsingConstructor
          (MessageGenerator *this,Printer *printer)

{
  scoped_array<const_google::protobuf::FieldDescriptor_*> sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type type;
  WireType type_00;
  FieldDescriptor **ppFVar5;
  string *value;
  FieldDescriptor *field_00;
  char *__s;
  FieldGenerator *pFVar6;
  uint i_00;
  uint i_01;
  ulong uVar7;
  ulong extraout_RDX;
  FieldDescriptor *field_2;
  undefined1 local_e8 [4];
  int i_3;
  uint32 local_c4;
  undefined1 local_c0 [4];
  uint32 packed_tag;
  uint32 local_9c;
  FieldDescriptor *pFStack_98;
  uint32 tag;
  FieldDescriptor *field_1;
  int i_2;
  string local_68;
  uint local_48;
  int local_44;
  int i_1;
  int totalBuilderInts;
  FieldGenerator *field;
  int local_30;
  int i;
  int totalBuilderBits;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_20;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  sorted_fields.array_ = (FieldDescriptor **)printer;
  ppFVar5 = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array(&local_20,ppFVar5)
  ;
  sVar1 = sorted_fields;
  value = Descriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print((Printer *)sVar1.array_,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",value);
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"initFields();\n");
  local_30 = 0;
  for (field._4_4_ = 0; iVar4 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; field._4_4_ = field._4_4_ + 1) {
    field_00 = Descriptor::field(this->descriptor_,field._4_4_);
    _i_1 = FieldGeneratorMap::get(&this->field_generators_,field_00);
    iVar4 = (*_i_1->_vptr_FieldGenerator[3])();
    local_30 = iVar4 + local_30;
  }
  local_44 = (local_30 + 0x1f) / 0x20;
  uVar7 = (long)(local_30 + 0x1f) % 0x20 & 0xffffffff;
  for (local_48 = 0; sVar1.array_ = sorted_fields.array_, (int)local_48 < local_44;
      local_48 = local_48 + 1) {
    GetBitFieldName_abi_cxx11_(&local_68,(java *)(ulong)local_48,(int)uVar7);
    io::Printer::Print((Printer *)sVar1.array_,"int mutable_$bit_field_name$ = 0;\n",
                       "bit_field_name",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    uVar7 = extraout_RDX;
  }
  bVar2 = HasUnknownFields(this->descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"try {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"int tag = input.readTag();\nswitch (tag) {\n")
  ;
  io::Printer::Indent((Printer *)sorted_fields.array_);
  sVar1 = sorted_fields;
  bVar2 = HasUnknownFields(this->descriptor_);
  __s = "";
  if (bVar2) {
    __s = " unknownFields,";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_2,__s,(allocator<char> *)((long)&field_1 + 7));
  io::Printer::Print((Printer *)sVar1.array_,
                     "case 0:\n  done = true;\n  break;\ndefault: {\n  if (!parseUnknownField(input,$unknown_fields$\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
                     ,"unknown_fields",(string *)&i_2);
  std::__cxx11::string::~string((string *)&i_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&field_1 + 7));
  for (field_1._0_4_ = 0; iVar4 = (int)field_1, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; field_1._0_4_ = (int)field_1 + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_20,(long)(int)field_1);
    pFStack_98 = *ppFVar5;
    iVar4 = FieldDescriptor::number(pFStack_98);
    type = FieldDescriptor::type(pFStack_98);
    type_00 = internal::WireFormat::WireTypeForFieldType(type);
    local_9c = internal::WireFormatLite::MakeTag(iVar4,type_00);
    sVar1 = sorted_fields;
    SimpleItoa_abi_cxx11_((string *)local_c0,(protobuf *)(ulong)local_9c,i_00);
    io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    io::Printer::Indent((Printer *)sorted_fields.array_);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_98);
    (*pFVar6->_vptr_FieldGenerator[0xb])(pFVar6,sorted_fields.array_);
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    bVar2 = FieldDescriptor::is_packable(pFStack_98);
    if (bVar2) {
      iVar4 = FieldDescriptor::number(pFStack_98);
      local_c4 = internal::WireFormatLite::MakeTag(iVar4,WIRETYPE_LENGTH_DELIMITED);
      sVar1 = sorted_fields;
      SimpleItoa_abi_cxx11_((string *)local_e8,(protobuf *)(ulong)local_c4,i_01);
      io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_e8);
      std::__cxx11::string::~string((string *)local_e8);
      io::Printer::Indent((Printer *)sorted_fields.array_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_98);
      (*pFVar6->_vptr_FieldGenerator[0xc])(pFVar6,sorted_fields.array_);
      io::Printer::Outdent((Printer *)sorted_fields.array_);
      io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    }
  }
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"  }\n}\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent((Printer *)sorted_fields.array_);
  for (field_2._4_4_ = 0; iVar4 = Descriptor::field_count(this->descriptor_), field_2._4_4_ < iVar4;
      field_2._4_4_ = field_2._4_4_ + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_20,(long)field_2._4_4_);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
    (*pFVar6->_vptr_FieldGenerator[0xd])(pFVar6,sorted_fields.array_);
  }
  bVar2 = HasUnknownFields(this->descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"makeExtensionsImmutable();\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"  }\n}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_20);
  return;
}

Assistant:

void MessageGenerator::GenerateParsingConstructor(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "initFields();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n"
    "default: {\n"
    "  if (!parseUnknownField(input,$unknown_fields$\n"
    "                         extensionRegistry, tag)) {\n"
    "    done = true;\n"  // it's an endgroup tag
    "  }\n"
    "  break;\n"
    "}\n",
    "unknown_fields", HasUnknownFields(descriptor_)
        ? " unknownFields," : "");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e.getMessage()).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  // Make unknown fields immutable.
  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}